

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_sstream.c
# Opt level: O3

void HTS_SStreamSet_initialize(HTS_SStreamSet *sss)

{
  sss->total_state = 0;
  sss->total_frame = 0;
  sss->nstate = 0;
  sss->duration = (size_t *)0x0;
  sss->sstream = (HTS_SStream *)0x0;
  sss->nstream = 0;
  return;
}

Assistant:

void HTS_SStreamSet_initialize(HTS_SStreamSet * sss)
{
   sss->nstream = 0;
   sss->nstate = 0;
   sss->sstream = NULL;
   sss->duration = NULL;
   sss->total_state = 0;
   sss->total_frame = 0;
}